

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyImplPrivate::error
          (QNetworkReplyImplPrivate *this,NetworkError code,QString *errorMessage)

{
  QNetworkReplyImpl *file;
  QMessageLogger *in_RDX;
  NetworkError in_ESI;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyImpl *q;
  undefined4 in_stack_ffffffffffffffa8;
  NetworkError in_stack_ffffffffffffffac;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = q_func(in_RDI);
  if ((in_RDI->super_QNetworkReplyPrivate).errorCode == NoError) {
    (in_RDI->super_QNetworkReplyPrivate).errorCode = in_ESI;
    QIODevice::setErrorString((QString *)file);
    QNetworkReply::errorOccurred((QNetworkReply *)0x1e9efd,in_stack_ffffffffffffffac);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)file,(int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QMessageLogger::warning
              (local_28,
               "QNetworkReplyImplPrivate::error: Internal problem, this method must only be called once."
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::error(QNetworkReplyImpl::NetworkError code, const QString &errorMessage)
{
    Q_Q(QNetworkReplyImpl);
    // Can't set and emit multiple errors.
    if (errorCode != QNetworkReply::NoError) {
        qWarning( "QNetworkReplyImplPrivate::error: Internal problem, this method must only be called once.");
        return;
    }

    errorCode = code;
    q->setErrorString(errorMessage);

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    emit q->errorOccurred(code);
}